

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlPatternCompileSafe
              (xmlChar *pattern,xmlDict *dict,int flags,xmlChar **namespaces,
              xmlPatternPtr *patternOut)

{
  xmlChar xVar1;
  xmlPatOp xVar2;
  xmlStepOpPtr pxVar3;
  xmlDictPtr dict_00;
  xmlStreamStepPtr pxVar4;
  bool bVar5;
  bool bVar6;
  xmlStepOpPtr pxVar7;
  xmlPatternPtr pxVar8;
  char cVar9;
  int iVar10;
  xmlPatParserContextPtr ctxt;
  xmlPatternPtr pxVar11;
  byte *pbVar12;
  xmlStreamCompPtr pxVar13;
  uint uVar14;
  uint uVar15;
  byte *pbVar16;
  xmlChar **ppxVar17;
  xmlChar *ns;
  xmlChar **ppxVar18;
  ulong uVar19;
  ulong uVar20;
  xmlChar *pxVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  bool bVar27;
  uint local_7c;
  xmlPatternPtr local_60;
  xmlChar *local_50;
  
  if (patternOut == (xmlPatternPtr *)0x0) {
    iVar10 = 1;
  }
  else {
    if (pattern == (xmlChar *)0x0) {
      iVar10 = 1;
      local_60 = (xmlPatternPtr)0x0;
      ctxt = (xmlPatParserContextPtr)0x0;
      local_50 = (xmlChar *)0x0;
LAB_00172a17:
      if (ctxt != (xmlPatParserContextPtr)0x0) {
        *(undefined4 *)&ctxt->namespaces = 0xffffffff;
        *(undefined4 *)((long)&ctxt->namespaces + 4) = 0xffffffff;
        ctxt->nb_namespaces = -1;
        *(undefined4 *)&ctxt->field_0x3c = 0xffffffff;
        *(undefined4 *)&ctxt->comp = 0xffffffff;
        *(undefined4 *)((long)&ctxt->comp + 4) = 0xffffffff;
        *(undefined4 *)&ctxt->elem = 0xffffffff;
        *(undefined4 *)((long)&ctxt->elem + 4) = 0xffffffff;
        ctxt->error = -1;
        *(undefined4 *)&ctxt->field_0x14 = 0xffffffff;
        *(undefined4 *)&ctxt->dict = 0xffffffff;
        *(undefined4 *)((long)&ctxt->dict + 4) = 0xffffffff;
        *(undefined4 *)&ctxt->cur = 0xffffffff;
        *(undefined4 *)((long)&ctxt->cur + 4) = 0xffffffff;
        *(undefined4 *)&ctxt->base = 0xffffffff;
        *(undefined4 *)((long)&ctxt->base + 4) = 0xffffffff;
        (*xmlFree)(ctxt);
      }
      if (local_60 != (xmlPatternPtr)0x0) {
        xmlFreePatternList(local_60);
      }
      if (local_50 != (xmlChar *)0x0) {
        (*xmlFree)(local_50);
      }
      local_60 = (xmlPatternPtr)0x0;
    }
    else {
      if (*pattern != '\0') {
        uVar14 = flags | 0x200;
        bVar27 = true;
        local_7c = 0;
        local_60 = (xmlPatternPtr)0x0;
LAB_00171f73:
        lVar26 = 0;
        while( true ) {
          if (pattern[lVar26] == '\0') break;
          if (pattern[lVar26] == '|') {
            local_50 = xmlStrndup(pattern,(int)lVar26);
            if (local_50 == (xmlChar *)0x0) {
              ctxt = (xmlPatParserContextPtr)0x0;
            }
            else {
              ctxt = xmlNewPatParserContext(local_50,dict,namespaces);
            }
            lVar26 = lVar26 + 1;
            goto LAB_00171fe3;
          }
          lVar26 = lVar26 + 1;
        }
        ctxt = xmlNewPatParserContext(pattern,dict,namespaces);
        local_50 = (xmlChar *)0x0;
LAB_00171fe3:
        pattern = pattern + lVar26;
        iVar10 = -1;
        if (ctxt == (xmlPatParserContextPtr)0x0) goto LAB_00172a02;
        pxVar11 = (xmlPatternPtr)(*xmlMalloc)(0x40);
        if (pxVar11 == (xmlPatternPtr)0x0) {
          pxVar11 = (xmlPatternPtr)0x0;
        }
        else {
          pxVar11->steps = (xmlStepOpPtr)0x0;
          pxVar11->stream = (xmlStreamCompPtr)0x0;
          pxVar11->flags = 0;
          pxVar11->nbStep = 0;
          pxVar11->maxStep = 0;
          *(undefined4 *)&pxVar11->field_0x2c = 0;
          pxVar11->next = (_xmlPattern *)0x0;
          pxVar11->pattern = (xmlChar *)0x0;
          pxVar11->data = (void *)0x0;
          pxVar11->dict = (xmlDictPtr)0x0;
        }
        if (pxVar11 != (xmlPatternPtr)0x0) {
          if (dict != (xmlDict *)0x0) {
            pxVar11->dict = dict;
            xmlDictReference(dict);
          }
          pxVar8 = pxVar11;
          if (local_60 != (xmlPatternPtr)0x0) {
            pxVar11->next = local_60->next;
            local_60->next = pxVar11;
            pxVar8 = local_60;
          }
          local_60 = pxVar8;
          pxVar11->flags = flags;
          ctxt->comp = pxVar11;
          pbVar12 = ctxt->cur;
          pbVar16 = pbVar12;
          if ((flags & 6U) != 0) {
            while( true ) {
              pbVar16 = pbVar16 + 1;
              uVar22 = (ulong)*pbVar12;
              if (0x2f < uVar22) break;
              if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                if (uVar22 == 0x2f) goto LAB_0017242b;
                break;
              }
              pbVar12 = pbVar12 + 1;
              ctxt->cur = pbVar12;
            }
            pxVar11->flags = uVar14;
            if (*pbVar12 != 0x2e) goto LAB_001722b1;
            while( true ) {
              ctxt->cur = pbVar16;
              uVar22 = (ulong)*pbVar16;
              if (0x2f < uVar22) break;
              if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                if (uVar22 == 0) {
                  iVar10 = xmlPatternAdd(ctxt,pxVar11,XML_OP_ELEM,(xmlChar *)0x0,(xmlChar *)0x0);
                  if (iVar10 == 0) goto LAB_00172432;
                }
                else if (uVar22 == 0x2f) goto LAB_00172117;
                break;
              }
              pbVar16 = pbVar16 + 1;
            }
            goto LAB_0017242b;
          }
          while( true ) {
            pbVar16 = pbVar12 + 1;
            uVar22 = (ulong)*pbVar12;
            if (0x2f < uVar22) break;
            if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
              uVar15 = uVar14;
              if ((uVar22 == 0x2e) || (uVar15 = flags | 0x100, uVar22 == 0x2f)) goto LAB_001721a0;
              break;
            }
            ctxt->cur = pbVar16;
            pbVar12 = pbVar16;
          }
          uVar15 = uVar14;
          if ((flags & 1U) != 0) {
LAB_001721a0:
            pxVar11->flags = uVar15;
          }
          if (*pbVar12 == 0x2e) {
            if ((*pbVar16 == 0x2f) && (pbVar12[2] == 0x2f)) {
              iVar10 = xmlPatternAdd(ctxt,pxVar11,XML_OP_ANCESTOR,(xmlChar *)0x0,(xmlChar *)0x0);
              if (iVar10 != 0) goto LAB_00172432;
              if (*ctxt->cur != '\0') {
                ctxt->cur = ctxt->cur + 1;
              }
              if (*ctxt->cur != '\0') {
                ctxt->cur = ctxt->cur + 1;
              }
              if (*ctxt->cur != '\0') {
                ctxt->cur = ctxt->cur + 1;
              }
              pbVar12 = ctxt->cur;
              while( true ) {
                uVar22 = (ulong)*pbVar12;
                if (0x20 < uVar22) break;
                if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                  if (uVar22 == 0) goto LAB_0017242b;
                  break;
                }
                ctxt->cur = pbVar12 + 1;
                pbVar12 = pbVar12 + 1;
              }
            }
LAB_00172373:
            xVar1 = *ctxt->cur;
            if (xVar1 == '/') {
              iVar10 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ROOT,(xmlChar *)0x0,(xmlChar *)0x0);
              if (iVar10 == 0) {
                if (*ctxt->cur != '\0') {
                  ctxt->cur = ctxt->cur + 1;
                }
                pbVar12 = ctxt->cur;
                while( true ) {
                  uVar22 = (ulong)*pbVar12;
                  if (0x20 < uVar22) break;
                  if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                    if (uVar22 == 0) goto LAB_0017242b;
                    break;
                  }
                  ctxt->cur = pbVar12 + 1;
                  pbVar12 = pbVar12 + 1;
                }
                goto LAB_001726d7;
              }
            }
            else if (xVar1 == '@') {
              ctxt->cur = ctxt->cur + 1;
              xmlCompileAttributeTest(ctxt);
              if (ctxt->error == 0) {
                pbVar12 = ctxt->cur;
                while( true ) {
                  uVar22 = (ulong)*pbVar12;
                  if (0x20 < uVar22) break;
                  if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                    if (uVar22 == 0) goto LAB_00172414;
                    break;
                  }
                  ctxt->cur = pbVar12 + 1;
                  pbVar12 = pbVar12 + 1;
                }
                xmlCompileStepPattern(ctxt);
                if (ctxt->error == 0) {
LAB_00172414:
                  if (*ctxt->cur != '\0') goto LAB_0017242b;
                }
              }
            }
            else {
LAB_001726d7:
              xmlCompileStepPattern(ctxt);
              if (ctxt->error == 0) {
                pbVar12 = ctxt->cur;
                while( true ) {
                  if ((0x20 < (ulong)*pbVar12) ||
                     ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
                  ctxt->cur = pbVar12 + 1;
                  pbVar12 = pbVar12 + 1;
                }
                do {
                  if (*ctxt->cur != '/') goto LAB_00172414;
                  if (ctxt->cur[1] == '/') {
                    iVar10 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ANCESTOR,(xmlChar *)0x0,
                                           (xmlChar *)0x0);
                    if (iVar10 != 0) break;
                    if (*ctxt->cur != '\0') {
                      ctxt->cur = ctxt->cur + 1;
                    }
                    if (*ctxt->cur != '\0') {
                      ctxt->cur = ctxt->cur + 1;
                    }
                    pbVar12 = ctxt->cur;
                    while( true ) {
                      if ((0x20 < (ulong)*pbVar12) ||
                         ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
                      ctxt->cur = pbVar12 + 1;
                      pbVar12 = pbVar12 + 1;
                    }
                  }
                  else {
                    iVar10 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_PARENT,(xmlChar *)0x0,
                                           (xmlChar *)0x0);
                    if (iVar10 != 0) break;
                    if (*ctxt->cur != '\0') {
                      ctxt->cur = ctxt->cur + 1;
                    }
                    pbVar12 = ctxt->cur;
                    while( true ) {
                      uVar22 = (ulong)*pbVar12;
                      if (0x20 < uVar22) break;
                      if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                        if (uVar22 == 0) goto LAB_0017242b;
                        break;
                      }
                      ctxt->cur = pbVar12 + 1;
                      pbVar12 = pbVar12 + 1;
                    }
                  }
                  xmlCompileStepPattern(ctxt);
                } while (ctxt->error == 0);
              }
            }
          }
          else {
            if ((*pbVar12 != 0x2f) || (*pbVar16 != 0x2f)) goto LAB_00172373;
            iVar10 = xmlPatternAdd(ctxt,pxVar11,XML_OP_ANCESTOR,(xmlChar *)0x0,(xmlChar *)0x0);
            if (iVar10 == 0) {
              if (*ctxt->cur != '\0') {
                ctxt->cur = ctxt->cur + 1;
              }
              if (*ctxt->cur != '\0') {
                ctxt->cur = ctxt->cur + 1;
              }
              goto LAB_00172373;
            }
          }
          goto LAB_00172432;
        }
        goto LAB_00172a17;
      }
      bVar27 = true;
      local_60 = (xmlPatternPtr)0x0;
LAB_001729c9:
      iVar10 = 0;
      pxVar11 = local_60;
      if (!bVar27) {
        for (; pxVar11 != (xmlPatternPtr)0x0; pxVar11 = pxVar11->next) {
          if (pxVar11->stream != (xmlStreamCompPtr)0x0) {
            xmlFreeStreamComp(pxVar11->stream);
            pxVar11->stream = (xmlStreamCompPtr)0x0;
          }
        }
      }
    }
    *patternOut = local_60;
  }
  return iVar10;
  while ((0x100002600U >> (uVar22 & 0x3f) & 1) != 0) {
LAB_00172117:
    pbVar12 = pbVar16;
    pbVar16 = pbVar12 + 1;
    ctxt->cur = pbVar16;
    uVar22 = (ulong)*pbVar16;
    if (0x2f < uVar22) goto LAB_001722a5;
  }
  if (uVar22 == 0x2f) {
    uVar22 = (ulong)*pbVar12;
    if (((0x20 < uVar22) || ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0)) &&
       (iVar10 = xmlPatternAdd(ctxt,pxVar11,XML_OP_ANCESTOR,(xmlChar *)0x0,(xmlChar *)0x0),
       iVar10 == 0)) {
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      pbVar12 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
        break;
        ctxt->cur = pbVar12 + 1;
        pbVar12 = pbVar12 + 1;
      }
      goto LAB_001722a5;
    }
  }
  else {
LAB_001722a5:
    if (*ctxt->cur != '\0') {
LAB_001722b1:
      xmlCompileStepPattern(ctxt);
      if (ctxt->error == 0) {
        while( true ) {
          pbVar12 = ctxt->cur;
          while( true ) {
            uVar22 = (ulong)*pbVar12;
            if (0x2f < uVar22) goto LAB_0017242b;
            if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) break;
            ctxt->cur = pbVar12 + 1;
            pbVar12 = pbVar12 + 1;
          }
          if (uVar22 == 0) goto LAB_00172432;
          if ((uVar22 != 0x2f) ||
             (iVar10 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_PARENT,(xmlChar *)0x0,(xmlChar *)0x0),
             iVar10 != 0)) break;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
          pbVar12 = ctxt->cur;
          while( true ) {
            uVar22 = (ulong)*pbVar12;
            if (0x2f < uVar22) break;
            if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
              if ((uVar22 == 0) || (uVar22 == 0x2f)) goto LAB_0017242b;
              break;
            }
            ctxt->cur = pbVar12 + 1;
            pbVar12 = pbVar12 + 1;
          }
          xmlCompileStepPattern(ctxt);
          if (ctxt->error != 0) break;
        }
      }
    }
  }
LAB_0017242b:
  ctxt->error = 1;
LAB_00172432:
  iVar10 = ctxt->error;
  if (iVar10 != 0) goto LAB_00172a17;
  *(undefined4 *)&ctxt->namespaces = 0xffffffff;
  *(undefined4 *)((long)&ctxt->namespaces + 4) = 0xffffffff;
  ctxt->nb_namespaces = -1;
  *(undefined4 *)&ctxt->field_0x3c = 0xffffffff;
  *(undefined4 *)&ctxt->comp = 0xffffffff;
  *(undefined4 *)((long)&ctxt->comp + 4) = 0xffffffff;
  *(undefined4 *)&ctxt->elem = 0xffffffff;
  *(undefined4 *)((long)&ctxt->elem + 4) = 0xffffffff;
  ctxt->error = -1;
  *(undefined4 *)&ctxt->field_0x14 = 0xffffffff;
  *(undefined4 *)&ctxt->dict = 0xffffffff;
  *(undefined4 *)((long)&ctxt->dict + 4) = 0xffffffff;
  *(undefined4 *)&ctxt->cur = 0xffffffff;
  *(undefined4 *)((long)&ctxt->cur + 4) = 0xffffffff;
  *(undefined4 *)&ctxt->base = 0xffffffff;
  *(undefined4 *)((long)&ctxt->base + 4) = 0xffffffff;
  (*xmlFree)(ctxt);
  if (bVar27) {
    if (local_7c == 0x200) {
      uVar15 = pxVar11->flags & 0x100;
      cVar9 = (char)(uVar15 >> 8);
      bVar27 = uVar15 == 0;
      local_7c = 0x200;
    }
    else if (local_7c == 0x100) {
      uVar15 = pxVar11->flags & 0x200;
      cVar9 = (char)(uVar15 >> 9);
      bVar27 = uVar15 == 0;
      local_7c = 0x100;
    }
    else {
      bVar27 = true;
      if (local_7c == 0) {
        local_7c = pxVar11->flags & 0x300;
      }
      cVar9 = '\0';
    }
  }
  else {
    cVar9 = '\x01';
    bVar27 = false;
  }
  if (cVar9 == '\0') {
    pxVar3 = pxVar11->steps;
    iVar10 = -1;
    if (pxVar3 == (xmlStepOpPtr)0x0) {
LAB_001726d0:
      bVar6 = false;
    }
    else if ((((pxVar11->nbStep == 1) && (pxVar3->op == XML_OP_ELEM)) &&
             (pxVar3->value == (xmlChar *)0x0)) && (pxVar3->value2 == (xmlChar *)0x0)) {
      bVar6 = false;
      pxVar13 = xmlNewStreamComp(0);
      if (pxVar13 != (xmlStreamCompPtr)0x0) {
        pbVar12 = (byte *)((long)&pxVar13->flags + 1);
        *pbVar12 = *pbVar12 | 0x40;
        pxVar11->stream = pxVar13;
        bVar6 = true;
        iVar10 = 0;
      }
    }
    else {
      pxVar13 = xmlNewStreamComp(pxVar11->nbStep / 2 + 1);
      if (pxVar13 == (xmlStreamCompPtr)0x0) goto LAB_001726d0;
      dict_00 = pxVar11->dict;
      if (dict_00 != (xmlDictPtr)0x0) {
        pxVar13->dict = dict_00;
        xmlDictReference(dict_00);
      }
      if ((pxVar11->flags & 0x100) != 0) {
        pbVar12 = (byte *)((long)&pxVar13->flags + 1);
        *pbVar12 = *pbVar12 | 0x80;
      }
      uVar22 = (ulong)(uint)pxVar11->nbStep;
      if (pxVar11->nbStep < 1) {
        uVar15 = 0;
        bVar6 = true;
      }
      else {
        uVar20 = 0xffffffff;
        lVar26 = 0;
        uVar15 = 0;
        uVar25 = 0;
        bVar6 = false;
        uVar19 = 1;
        do {
          pxVar3 = pxVar11->steps;
          iVar10 = *(int *)((long)&pxVar3->op + lVar26);
          if (7 < iVar10 - 1U) goto switchD_001725b9_caseD_5;
          pxVar21 = *(xmlChar **)((long)&pxVar3->value + lVar26);
          ns = *(xmlChar **)((long)&pxVar3->value2 + lVar26);
          switch(iVar10) {
          case 1:
            bVar6 = true;
            if (lVar26 != 0) goto LAB_0017280d;
            break;
          case 2:
            if (pxVar21 != (xmlChar *)0x0 || ns != (xmlChar *)0x0) goto switchD_001725b9_caseD_3;
            if (uVar25 != 0 && uVar19 == (uVar22 & 0xffffffff)) {
              pbVar12 = (byte *)((long)&pxVar13->flags + 1);
              *pbVar12 = *pbVar12 | 0x40;
              uVar15 = xmlStreamCompAddStep(pxVar13,(xmlChar *)0x0,(xmlChar *)0x0,100,uVar25 | 0x10)
              ;
              if ((int)uVar15 < 0) goto LAB_0017280d;
              uVar25 = 0;
              if ((int)uVar20 != -1) {
                pxVar13->steps[uVar20].flags = pxVar13->steps[uVar20].flags | 0x20;
              }
              uVar20 = 0xffffffff;
            }
            break;
          case 3:
switchD_001725b9_caseD_3:
            goto LAB_0017264d;
          case 4:
            uVar15 = xmlStreamCompAddStep(pxVar13,pxVar21,ns,2,uVar25 | 8);
            if (-1 < (int)uVar15) {
              uVar20 = 0xffffffff;
              goto LAB_0017268e;
            }
            goto LAB_0017280d;
          case 6:
            if (uVar25 == 0) {
              uVar25 = 1;
              if (((uint)pxVar13->flags >> 0x10 & 1) == 0) {
                pxVar13->flags = pxVar13->flags | 0x10000;
              }
            }
            break;
          case 7:
            ns = pxVar21;
            pxVar21 = (xmlChar *)0x0;
            goto LAB_0017264d;
          case 8:
            ns = (xmlChar *)0x0;
            pxVar21 = (xmlChar *)0x0;
LAB_0017264d:
            uVar15 = xmlStreamCompAddStep(pxVar13,pxVar21,ns,1,uVar25);
            if ((int)uVar15 < 0) goto LAB_0017280d;
            uVar20 = (ulong)uVar15;
LAB_0017268e:
            uVar25 = 0;
          }
switchD_001725b9_caseD_5:
          uVar22 = (ulong)pxVar11->nbStep;
          lVar26 = lVar26 + 0x18;
          bVar5 = (long)uVar19 < (long)uVar22;
          uVar19 = uVar19 + 1;
        } while (bVar5);
        bVar6 = !bVar6;
      }
      if ((bVar6) && ((pxVar11->flags & 7) == 0)) {
        if (((uint)pxVar13->flags >> 0x10 & 1) == 0) {
          pxVar13->flags = pxVar13->flags | 0x10000;
        }
        if (0 < pxVar13->nbStep) {
          uVar25 = pxVar13->steps->flags;
          if ((uVar25 & 1) == 0) {
            pxVar13->steps->flags = uVar25 | 1;
          }
        }
      }
      if ((int)uVar15 < pxVar13->nbStep) {
        pxVar4 = pxVar13->steps;
        pxVar4[uVar15].flags = pxVar4[uVar15].flags | 2;
        if (!bVar6) {
          *(byte *)&pxVar4->flags = (byte)pxVar4->flags | 4;
        }
        pxVar11->stream = pxVar13;
      }
      else {
LAB_0017280d:
        xmlFreeStreamComp(pxVar13);
      }
      iVar10 = 0;
      bVar6 = true;
    }
    if (!bVar6) goto LAB_00172a02;
  }
  iVar10 = pxVar11->nbStep;
  if ((0 < iVar10) && (pxVar11->steps->op == XML_OP_ANCESTOR)) {
    if (iVar10 != 1) {
      uVar22 = (ulong)(iVar10 - 1);
      ppxVar17 = &pxVar11->steps[1].value2;
      do {
        ppxVar17[-4] = ppxVar17[-1];
        ppxVar17[-3] = *ppxVar17;
        *(xmlPatOp *)(ppxVar17 + -5) = ((xmlStepOp *)(ppxVar17 + -2))->op;
        ppxVar17 = ppxVar17 + 3;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
    }
    pxVar11->nbStep = iVar10 + -1;
  }
  if ((pxVar11->nbStep < pxVar11->maxStep) || (iVar10 = xmlPatternGrow(pxVar11), -1 < iVar10)) {
    iVar10 = pxVar11->nbStep;
    lVar26 = (long)iVar10;
    if (1 < lVar26) {
      ppxVar18 = &pxVar11->steps[lVar26 + -1].value2;
      ppxVar17 = &pxVar11->steps->value2;
      lVar24 = 0;
      lVar23 = lVar26 + -2;
      do {
        pxVar21 = ppxVar17[-1];
        ppxVar17[-1] = ppxVar18[-1];
        ppxVar18[-1] = pxVar21;
        pxVar21 = *ppxVar17;
        *ppxVar17 = *ppxVar18;
        *ppxVar18 = pxVar21;
        xVar2 = ((xmlStepOp *)(ppxVar17 + -2))->op;
        ((xmlStepOp *)(ppxVar17 + -2))->op = ((xmlStepOp *)(ppxVar18 + -2))->op;
        ((xmlStepOp *)(ppxVar18 + -2))->op = xVar2;
        lVar24 = lVar24 + 1;
        ppxVar17 = ppxVar17 + 3;
        ppxVar18 = ppxVar18 + -3;
        bVar6 = lVar24 < lVar23;
        lVar23 = lVar23 + -1;
      } while (bVar6);
    }
    pxVar3 = pxVar11->steps;
    pxVar7 = pxVar3 + lVar26;
    pxVar7->value = (xmlChar *)0x0;
    pxVar7->value2 = (xmlChar *)0x0;
    pxVar11->nbStep = iVar10 + 1;
    pxVar3[lVar26].op = XML_OP_END;
    iVar10 = 0;
    bVar6 = true;
  }
  else {
    iVar10 = -1;
    bVar6 = false;
  }
  if (bVar6) {
    if (local_50 != (xmlChar *)0x0) {
      (*xmlFree)(local_50);
    }
    if (*pattern == '\0') goto LAB_001729c9;
    goto LAB_00171f73;
  }
LAB_00172a02:
  ctxt = (xmlPatParserContextPtr)0x0;
  goto LAB_00172a17;
}

Assistant:

int
xmlPatternCompileSafe(const xmlChar *pattern, xmlDict *dict, int flags,
                      const xmlChar **namespaces, xmlPatternPtr *patternOut) {
    xmlPatternPtr ret = NULL, cur;
    xmlPatParserContextPtr ctxt = NULL;
    const xmlChar *or, *start;
    xmlChar *tmp = NULL;
    int type = 0;
    int streamable = 1;
    int error;

    if (patternOut == NULL)
        return(1);

    if (pattern == NULL) {
        error = 1;
        goto error;
    }

    start = pattern;
    or = start;
    while (*or != 0) {
	tmp = NULL;
	while ((*or != 0) && (*or != '|')) or++;
        if (*or == 0)
	    ctxt = xmlNewPatParserContext(start, dict, namespaces);
	else {
	    tmp = xmlStrndup(start, or - start);
	    if (tmp != NULL) {
		ctxt = xmlNewPatParserContext(tmp, dict, namespaces);
	    }
	    or++;
	}
	if (ctxt == NULL) {
            error = -1;
            goto error;
        }
	cur = xmlNewPattern();
	if (cur == NULL) {
            error = -1;
            goto error;
        }
	/*
	* Assign string dict.
	*/
	if (dict) {
	    cur->dict = dict;
	    xmlDictReference(dict);
	}
	if (ret == NULL)
	    ret = cur;
	else {
	    cur->next = ret->next;
	    ret->next = cur;
	}
	cur->flags = flags;
	ctxt->comp = cur;

	if (XML_STREAM_XS_IDC(cur))
	    xmlCompileIDCXPathPath(ctxt);
	else
	    xmlCompilePathPattern(ctxt);
	if (ctxt->error != 0) {
            error = ctxt->error;
	    goto error;
        }
	xmlFreePatParserContext(ctxt);
	ctxt = NULL;


        if (streamable) {
	    if (type == 0) {
	        type = cur->flags & (PAT_FROM_ROOT | PAT_FROM_CUR);
	    } else if (type == PAT_FROM_ROOT) {
	        if (cur->flags & PAT_FROM_CUR)
		    streamable = 0;
	    } else if (type == PAT_FROM_CUR) {
	        if (cur->flags & PAT_FROM_ROOT)
		    streamable = 0;
	    }
	}
	if (streamable) {
	    error = xmlStreamCompile(cur);
            if (error != 0)
                goto error;
        }
	error = xmlReversePattern(cur);
        if (error != 0)
	    goto error;
	if (tmp != NULL) {
	    xmlFree(tmp);
	    tmp = NULL;
	}
	start = or;
    }
    if (streamable == 0) {
        cur = ret;
	while (cur != NULL) {
	    if (cur->stream != NULL) {
		xmlFreeStreamComp(cur->stream);
		cur->stream = NULL;
	    }
	    cur = cur->next;
	}
    }

    *patternOut = ret;
    return(0);
error:
    if (ctxt != NULL) xmlFreePatParserContext(ctxt);
    if (ret != NULL) xmlFreePattern(ret);
    if (tmp != NULL) xmlFree(tmp);
    *patternOut = NULL;
    return(error);
}